

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStrUtil.cpp
# Opt level: O2

ostream * glu::operator<<(ostream *str,ContextType contextType)

{
  ContextFlags CVar1;
  ContextFlags CVar2;
  Hex<8UL> hex;
  char **ppcVar3;
  int ndx;
  ulong uVar4;
  ContextFlags CVar5;
  
  operator<<(str,contextType.super_ApiType.m_bits & 0x3ff);
  CVar2 = (uint)contextType.super_ApiType.m_bits >> 10 &
          (CONTEXT_FORWARD_COMPATIBLE|CONTEXT_DEBUG|CONTEXT_ROBUST);
  if (CVar2 != 0) {
    std::operator<<(str," (");
    ppcVar3 = &operator<<::s_descs[0].desc;
    uVar4 = 0;
    CVar5 = CVar2;
    while ((uVar4 < 3 && (CVar5 != 0))) {
      CVar1 = ((anon_struct_16_2_3f1b513e *)(ppcVar3 + -1))->flag;
      if ((CVar1 & CVar5) != 0) {
        if (CVar5 != CVar2) {
          std::operator<<(str,", ");
        }
        std::operator<<(str,*ppcVar3);
        CVar5 = CVar5 & ~CVar1;
      }
      uVar4 = uVar4 + 1;
      ppcVar3 = ppcVar3 + 2;
    }
    if (CVar5 != 0) {
      if (CVar5 != CVar2) {
        std::operator<<(str,", ");
      }
      hex.value._4_4_ = 0;
      hex.value._0_4_ = CVar5;
      tcu::Format::operator<<(str,hex);
    }
    std::operator<<(str,")");
  }
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, ContextType contextType)
{
	str << contextType.getAPI();

	if (contextType.getFlags() != ContextFlags(0))
	{
		static const struct
		{
			ContextFlags	flag;
			const char*		desc;
		} s_descs[] =
		{
			{ CONTEXT_DEBUG,				"debug"					},
			{ CONTEXT_FORWARD_COMPATIBLE,	"forward-compatible"	},
			{ CONTEXT_ROBUST,				"robust"				}
		};
		ContextFlags	flags	= contextType.getFlags();

		str << " (";

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_descs) && flags != 0; ndx++)
		{
			if ((flags & s_descs[ndx].flag) != 0)
			{
				if (flags != contextType.getFlags())
					str << ", ";

				str << s_descs[ndx].desc;
				flags = flags & ~s_descs[ndx].flag;
			}
		}

		if (flags != 0)
		{
			// Unresolved
			if (flags != contextType.getFlags())
				str << ", ";
			str << tcu::toHex(flags);
		}

		str << ")";
	}

	return str;
}